

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExtraEclipseCDT4Generator.cxx
# Opt level: O0

void cmExtraEclipseCDT4Generator::AppendIncludeDirectories
               (cmXMLWriter *xml,
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *includeDirs,
               set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *emittedDirs)

{
  bool bVar1;
  ulong uVar2;
  reference in_relative;
  char *string;
  pair<std::_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool>
  pVar3;
  string local_1b8;
  allocator local_191;
  string local_190;
  _Base_ptr local_170;
  undefined1 local_168;
  _Self local_160;
  _Self local_158;
  string local_150;
  undefined1 local_120 [8];
  RegularExpression frameworkRx;
  string dir;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_28;
  const_iterator inc;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *emittedDirs_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *includeDirs_local;
  cmXMLWriter *xml_local;
  
  inc._M_current = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)emittedDirs;
  local_28._M_current =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
       std::
       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ::begin(includeDirs);
  while( true ) {
    dir.field_2._8_8_ =
         std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::end(includeDirs);
    bVar1 = __gnu_cxx::operator!=
                      (&local_28,
                       (__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *)((long)&dir.field_2 + 8));
    if (!bVar1) break;
    __gnu_cxx::
    __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator->(&local_28);
    uVar2 = std::__cxx11::string::empty();
    if ((uVar2 & 1) == 0) {
      in_relative = __gnu_cxx::
                    __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    ::operator*(&local_28);
      cmsys::SystemTools::CollapseFullPath((string *)&frameworkRx.searchstring,in_relative);
      cmsys::RegularExpression::RegularExpression
                ((RegularExpression *)local_120,"(.+/Frameworks)/.+\\.framework/");
      string = (char *)std::__cxx11::string::c_str();
      bVar1 = cmsys::RegularExpression::find((RegularExpression *)local_120,string);
      if (bVar1) {
        cmsys::RegularExpression::match_abi_cxx11_(&local_150,(RegularExpression *)local_120,1);
        std::__cxx11::string::operator=((string *)&frameworkRx.searchstring,(string *)&local_150);
        std::__cxx11::string::~string((string *)&local_150);
      }
      local_158._M_node =
           (_Base_ptr)
           std::
           set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::find((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)inc._M_current,(key_type *)&frameworkRx.searchstring);
      local_160._M_node =
           (_Base_ptr)
           std::
           set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::end((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)inc._M_current);
      bVar1 = std::operator==(&local_158,&local_160);
      if (bVar1) {
        pVar3 = std::
                set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::insert((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)inc._M_current,(value_type *)&frameworkRx.searchstring);
        local_170 = (_Base_ptr)pVar3.first._M_node;
        local_168 = pVar3.second;
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_190,"pathentry",&local_191);
        cmXMLWriter::StartElement(xml,&local_190);
        std::__cxx11::string::~string((string *)&local_190);
        std::allocator<char>::~allocator((allocator<char> *)&local_191);
        GetEclipsePath(&local_1b8,(string *)&frameworkRx.searchstring);
        cmXMLWriter::Attribute<std::__cxx11::string>(xml,"include",&local_1b8);
        std::__cxx11::string::~string((string *)&local_1b8);
        cmXMLWriter::Attribute<char[4]>(xml,"kind",(char (*) [4])0xa492ff);
        cmXMLWriter::Attribute<char[1]>(xml,"path",(char (*) [1])0xa67d2c);
        cmXMLWriter::Attribute<char[5]>(xml,"system",(char (*) [5])0xa43678);
        cmXMLWriter::EndElement(xml);
      }
      cmsys::RegularExpression::~RegularExpression((RegularExpression *)local_120);
      std::__cxx11::string::~string((string *)&frameworkRx.searchstring);
    }
    __gnu_cxx::
    __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator++(&local_28);
  }
  return;
}

Assistant:

void cmExtraEclipseCDT4Generator::AppendIncludeDirectories(
  cmXMLWriter& xml, const std::vector<std::string>& includeDirs,
  std::set<std::string>& emittedDirs)
{
  for (std::vector<std::string>::const_iterator inc = includeDirs.begin();
       inc != includeDirs.end(); ++inc) {
    if (!inc->empty()) {
      std::string dir = cmSystemTools::CollapseFullPath(*inc);

      // handle framework include dirs on OSX, the remainder after the
      // Frameworks/ part has to be stripped
      //   /System/Library/Frameworks/GLUT.framework/Headers
      cmsys::RegularExpression frameworkRx("(.+/Frameworks)/.+\\.framework/");
      if (frameworkRx.find(dir.c_str())) {
        dir = frameworkRx.match(1);
      }

      if (emittedDirs.find(dir) == emittedDirs.end()) {
        emittedDirs.insert(dir);
        xml.StartElement("pathentry");
        xml.Attribute("include",
                      cmExtraEclipseCDT4Generator::GetEclipsePath(dir));
        xml.Attribute("kind", "inc");
        xml.Attribute("path", "");
        xml.Attribute("system", "true");
        xml.EndElement();
      }
    }
  }
}